

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-store.c
# Opt level: O0

_Bool store_purchase(store_context *ctx,wchar_t item,_Bool single)

{
  store *store_00;
  object *obj_00;
  _Bool _Var1;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  char *pcVar5;
  command *pcVar6;
  _Bool local_c1;
  char *local_c0;
  wchar_t local_a8;
  _Bool obj_can_use;
  _Bool obj_is_book;
  _Bool response;
  _Bool flavor_aware;
  int32_t price;
  wchar_t num;
  wchar_t amt;
  char o_name [80];
  object *dummy;
  object *obj;
  store *store;
  _Bool single_local;
  wchar_t item_local;
  store_context *ctx_local;
  
  store_00 = ctx->store;
  obj_00 = ctx->list[item];
  o_name[0x48] = '\0';
  o_name[0x49] = '\0';
  o_name[0x4a] = '\0';
  o_name[0x4b] = '\0';
  o_name[0x4c] = '\0';
  o_name[0x4d] = '\0';
  o_name[0x4e] = '\0';
  o_name[0x4f] = '\0';
  msg_flag = false;
  prt("",L'\0',L'\0');
  if (single) {
    price = 1;
    _Var1 = store_is_home(store_00);
    if ((!_Var1) &&
       (wVar4 = player->au, wVar3 = price_item(store_00,obj_00,false,L'\x01'), wVar4 < wVar3)) {
      msg("You do not have enough gold for this item.");
      return false;
    }
  }
  else {
    _Var1 = store_is_home(store_00);
    if (_Var1) {
      price = (int32_t)obj_00->number;
    }
    else {
      wVar4 = price_item(store_00,obj_00,false,L'\x01');
      if ((uint)player->au < (uint)wVar4) {
        msg("You do not have enough gold for this item.");
        return false;
      }
      if (wVar4 == L'\0') {
        price = (int32_t)obj_00->number;
      }
      else {
        price = player->au / wVar4;
      }
      if ((int)(uint)obj_00->number < price) {
        price = (int32_t)obj_00->number;
      }
      wVar4 = player->au;
      wVar3 = price_item(store_00,obj_00,false,price + L'\x01');
      if ((wVar3 <= wVar4) && (price < (int)(uint)obj_00->number)) {
        price = price + 1;
      }
    }
    wVar4 = inven_carry_num(player,obj_00);
    if (wVar4 < price) {
      local_a8 = inven_carry_num(player,obj_00);
    }
    else {
      local_a8 = price;
    }
    _Var1 = object_flavor_is_aware(obj_00);
    if ((local_a8 < L'\x01') ||
       (((!_Var1 && (_Var2 = store_is_home(store_00), !_Var2)) && (_Var2 = pack_is_full(), _Var2))))
    {
      msg("You cannot carry that many items.");
      return false;
    }
    if ((_Var1) || (_Var1 = store_is_home(store_00), _Var1)) {
      _obj_can_use = find_inven(obj_00);
    }
    else {
      _obj_can_use = L'\0';
    }
    _Var1 = store_is_home(store_00);
    pcVar5 = "Buy";
    if (_Var1) {
      pcVar5 = "Take";
    }
    if (_obj_can_use == L'\0') {
      local_c0 = "";
    }
    else {
      local_c0 = format(" (you have %d)",(ulong)(uint)_obj_can_use);
    }
    strnfmt((char *)&num,0x50,"%s how many%s? (max %d) ",pcVar5,local_c0,(ulong)(uint)local_a8);
    price = get_quantity((char *)&num,local_a8);
    if (price < L'\x01') {
      return false;
    }
  }
  o_name._72_8_ = object_new();
  object_copy_amt((object *)o_name._72_8_,obj_00,price);
  _Var1 = inven_carry_okay((object *)o_name._72_8_);
  if (_Var1) {
    _Var1 = store_is_home(store_00);
    if (_Var1) {
      cmdq_push(CMD_RETRIEVE);
      pcVar6 = cmdq_peek();
      cmd_set_arg_item(pcVar6,"item",obj_00);
      pcVar6 = cmdq_peek();
      cmd_set_arg_number(pcVar6,"quantity",price);
    }
    else {
      _Var1 = tval_is_book_k(obj_00->kind);
      local_c1 = true;
      if (_Var1) {
        local_c1 = obj_can_browse(obj_00);
      }
      object_desc((char *)&num,0x50,(object *)o_name._72_8_,0x47,player);
      wVar4 = price_item(store_00,(object *)o_name._72_8_,false,
                         (uint)*(byte *)(o_name._72_8_ + 0x12a));
      screen_save();
      pcVar5 = format("Price: %ld",(long)wVar4);
      prt(pcVar5,L'\x01',L'\0');
      pcVar5 = " (Can\'t use!)";
      if (local_c1 != false) {
        pcVar5 = "";
      }
      pcVar5 = format("Buy %s?%s %s",&num,pcVar5,"[ESC, any other key to accept]");
      _Var1 = store_get_check(pcVar5);
      screen_load();
      if (!_Var1) {
        return false;
      }
      cmdq_push(CMD_BUY);
      pcVar6 = cmdq_peek();
      cmd_set_arg_item(pcVar6,"item",obj_00);
      pcVar6 = cmdq_peek();
      cmd_set_arg_number(pcVar6,"quantity",price);
    }
    ctx->flags = ctx->flags | 1;
    object_delete((chunk *)0x0,(chunk *)0x0,(object **)(o_name + 0x48));
    ctx_local._7_1_ = true;
  }
  else {
    msg("You cannot carry that many items.");
    object_delete((chunk *)0x0,(chunk *)0x0,(object **)(o_name + 0x48));
    ctx_local._7_1_ = false;
  }
  return ctx_local._7_1_;
}

Assistant:

static bool store_purchase(struct store_context *ctx, int item, bool single)
{
	struct store *store = ctx->store;

	struct object *obj = ctx->list[item];
	struct object *dummy = NULL;

	char o_name[80];

	int amt, num;

	int32_t price;

	/* Clear all current messages */
	msg_flag = false;
	prt("", 0, 0);


	/*** Check the player can get any at all ***/

	/* Get an amount if we weren't given one */
	if (single) {
		amt = 1;

		/* Check if the player can afford any at all */
		if (!store_is_home(store) &&
				player->au < price_item(store, obj, false, 1)) {
			msg("You do not have enough gold for this item.");
			return false;
		}
	} else {
		bool flavor_aware;

		if (store_is_home(store)) {
			amt = obj->number;
		} else {
			/* Price of one */
			price = price_item(store, obj, false, 1);

			/* Check if the player can afford any at all */
			if ((uint32_t)player->au < (uint32_t)price) {
				msg("You do not have enough gold for this item.");
				return false;
			}

			/* Work out how many the player can afford */
			if (price == 0)
				amt = obj->number; /* Prevent division by zero */
			else
				amt = player->au / price;

			if (amt > obj->number) amt = obj->number;

			/* Double check for wands/staves */
			if ((player->au >= price_item(store, obj, false, amt+1)) &&
				(amt < obj->number))
				amt++;
		}

		/* Limit to the number that can be carried */
		amt = MIN(amt, inven_carry_num(player, obj));

		/* Fail if there is no room.  Don't leak information about
		 * unknown flavors for a purchase (getting it from home doesn't
		 * leak information since it doesn't show the true flavor). */
		flavor_aware = object_flavor_is_aware(obj);
		if (amt <= 0 || (!flavor_aware && !store_is_home(store) &&
						 pack_is_full())) {
			msg("You cannot carry that many items.");
			return false;
		}

		/* Find the number of this item in the inventory.  As above,
		 * avoid leaking information about unknown flavors. */
		if (!flavor_aware && !store_is_home(store))
			num = 0;
		else
			num = find_inven(obj);

		strnfmt(o_name, sizeof o_name, "%s how many%s? (max %d) ",
				(store_is_home(store)) ? "Take" : "Buy",
				num ? format(" (you have %d)", num) : "", amt);

		/* Get a quantity */
		amt = get_quantity(o_name, amt);

		/* Allow user abort */
		if (amt <= 0) return false;
	}

	/* Get desired object */
	dummy = object_new();
	object_copy_amt(dummy, obj, amt);

	/* Ensure we have room */
	if (!inven_carry_okay(dummy)) {
		msg("You cannot carry that many items.");
		object_delete(NULL, NULL, &dummy);
		return false;
	}

	/* Attempt to buy it */
	if (!store_is_home(store)) {
		bool response;

		bool obj_is_book = tval_is_book_k(obj->kind);
		bool obj_can_use = !obj_is_book || obj_can_browse(obj);

		/* Describe the object (fully) */
		object_desc(o_name, sizeof(o_name), dummy,
			ODESC_PREFIX | ODESC_FULL | ODESC_STORE, player);

		/* Extract the price for the entire stack */
		price = price_item(store, dummy, false, dummy->number);

		screen_save();

		/* Show price */
		prt(format("Price: %ld", (long)price), 1, 0);

		/* Confirm purchase */
		response = store_get_check(format("Buy %s?%s %s",
					o_name,
					obj_can_use ? "" : " (Can't use!)",
					"[ESC, any other key to accept]"));

		screen_load();

		/* Negative response, so give up */
		if (!response) return false;

		cmdq_push(CMD_BUY);
		cmd_set_arg_item(cmdq_peek(), "item", obj);
		cmd_set_arg_number(cmdq_peek(), "quantity", amt);
	} else {
		/* Home is much easier */
		cmdq_push(CMD_RETRIEVE);
		cmd_set_arg_item(cmdq_peek(), "item", obj);
		cmd_set_arg_number(cmdq_peek(), "quantity", amt);
	}

	/* Update the display */
	ctx->flags |= STORE_GOLD_CHANGE;

	object_delete(NULL, NULL, &dummy);

	/* Not kicked out */
	return true;
}